

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcnn.cpp
# Opt level: O3

void __thiscall CppCNN::print_info(CppCNN *this,bool verbose)

{
  ostream *poVar1;
  long lVar2;
  
  lVar2 = this->__epoch_batch;
  if ((lVar2 * -0x70a3d70a3d70a3d7 + 0x51eb851eb851eb8U >> 2 | lVar2 * -0x70a3d70a3d70a3d7 << 0x3e)
      < 0x28f5c28f5c28f5d) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\r",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"print_info",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":: ",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"step: ",6);
    poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/",1);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", loss: ",8);
    poVar1 = std::ostream::_M_insert<double>(this->__loss);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"learning rate: ",0xf);
    std::ostream::_M_insert<double>(this->__learn_rate);
    std::ostream::flush();
    lVar2 = this->__epoch_batch;
  }
  if ((lVar2 * this->__mini_batch_size) % this->__examples_num != 0) {
    return;
  }
  this->__epoch = this->__epoch + 1;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"print_info",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":: ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"epoch: ",7);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/",1);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", loss: ",8);
  poVar1 = std::ostream::_M_insert<double>(this->__loss);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"learning rate: ",0xf);
  poVar1 = std::ostream::_M_insert<double>(this->__learn_rate);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void CppCNN::print_info(bool verbose) {
	if (__epoch_batch % 100 == 0) {
		cout << "\r" << __FUNCTION__ << ":: " << "step: " << __epoch_batch << "/" << __epoch_max * __examples_num / __mini_batch_size
			<< ", loss: " << __loss << ", " << "learning rate: " << __learn_rate << flush;
	}

	if ((__epoch_batch * __mini_batch_size) % __examples_num == 0) {
		__epoch++;

		//if (__learn_rate_decay_enabled) decay_learn_rate();

		cout << endl << __FUNCTION__ << ":: " << "epoch: " << __epoch << "/" << __epoch_max
			<< ", loss: " << __loss << ", " << "learning rate: " << __learn_rate << endl;
	}
}